

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Byte cff_fd_select_get(CFF_FDSelect fdselect,FT_UInt glyph_index)

{
  ushort *puVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort uVar4;
  uint uVar5;
  
  puVar1 = (ushort *)fdselect->data;
  if (puVar1 != (ushort *)0x0) {
    if (fdselect->format == '\x03') {
      if (glyph_index - fdselect->cache_first < fdselect->cache_count) {
        return fdselect->cache_fd;
      }
      puVar3 = puVar1 + 1;
      uVar4 = *puVar1 << 8 | *puVar1 >> 8;
      do {
        uVar5 = (uint)uVar4;
        if (glyph_index < uVar5) {
          return '\0';
        }
        uVar4 = *(ushort *)((long)puVar3 + 1) << 8 | *(ushort *)((long)puVar3 + 1) >> 8;
        if (glyph_index < uVar4) {
          uVar2 = *puVar3;
          fdselect->cache_first = uVar5;
          fdselect->cache_count = uVar4 - uVar5;
          fdselect->cache_fd = (FT_Byte)uVar2;
          return (FT_Byte)uVar2;
        }
        puVar3 = (ushort *)((long)puVar3 + 3);
      } while (puVar3 < (ushort *)((ulong)fdselect->data_size + (long)puVar1));
    }
    else if (fdselect->format == '\0') {
      return *(FT_Byte *)((long)puVar1 + (ulong)glyph_index);
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Byte )
  cff_fd_select_get( CFF_FDSelect  fdselect,
                     FT_UInt       glyph_index )
  {
    FT_Byte  fd = 0;


    /* if there is no FDSelect, return zero               */
    /* Note: CFF2 with just one Font Dict has no FDSelect */
    if ( !fdselect->data )
      goto Exit;

    switch ( fdselect->format )
    {
    case 0:
      fd = fdselect->data[glyph_index];
      break;

    case 3:
      /* first, compare to the cache */
      if ( (FT_UInt)( glyph_index - fdselect->cache_first ) <
                        fdselect->cache_count )
      {
        fd = fdselect->cache_fd;
        break;
      }

      /* then, look up the ranges array */
      {
        FT_Byte*  p       = fdselect->data;
        FT_Byte*  p_limit = p + fdselect->data_size;
        FT_Byte   fd2;
        FT_UInt   first, limit;


        first = FT_NEXT_USHORT( p );
        do
        {
          if ( glyph_index < first )
            break;

          fd2   = *p++;
          limit = FT_NEXT_USHORT( p );

          if ( glyph_index < limit )
          {
            fd = fd2;

            /* update cache */
            fdselect->cache_first = first;
            fdselect->cache_count = limit - first;
            fdselect->cache_fd    = fd2;
            break;
          }
          first = limit;

        } while ( p < p_limit );
      }
      break;

    default:
      ;
    }

  Exit:
    return fd;
  }